

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

void SendPreloadMsgs(CP_Services Svcs,Evpath_WSR_Stream WSR_Stream,TimestepList_conflict TS)

{
  _Evpath_WS_Stream *p_Var1;
  long lVar2;
  int i;
  ulong uVar3;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ulong local_48;
  undefined8 uStack_40;
  char *local_38;
  
  p_Var1 = WSR_Stream->WS_Stream;
  (*Svcs->verbose)(p_Var1->CP_Stream,4,"EVPATH Sending preload messages for timestep %ld\n",
                   TS->Timestep);
  local_58 = (undefined4)TS->Timestep;
  uStack_54 = *(undefined4 *)((long)&TS->Timestep + 4);
  uStack_50 = (undefined4)(TS->Data).DataSize;
  uStack_4c = *(undefined4 *)((long)&(TS->Data).DataSize + 4);
  local_38 = (TS->Data).block;
  local_48 = (ulong)(uint)p_Var1->Rank;
  lVar2 = 0;
  for (uVar3 = 0; (long)uVar3 < (long)WSR_Stream->ReaderCohortSize; uVar3 = uVar3 + 1) {
    if (WSR_Stream->ReaderRequestArray[uVar3] != '\0') {
      uStack_40 = *(undefined8 *)((long)&WSR_Stream->ReaderContactInfo->RS_Stream + lVar2);
      (*Svcs->verbose)(p_Var1->CP_Stream,5,
                       "EVPATH Preload message for timestep %ld, going to rank %d\n",TS->Timestep,
                       uVar3 & 0xffffffff);
      CMwrite(*(undefined8 *)((long)&WSR_Stream->ReaderContactInfo->Conn + lVar2),
              p_Var1->PreloadFormat,&local_58);
    }
    lVar2 = lVar2 + 0x18;
  }
  return;
}

Assistant:

static void SendPreloadMsgs(CP_Services Svcs, Evpath_WSR_Stream WSR_Stream, TimestepList TS)
{
    Evpath_WS_Stream WS_Stream = WSR_Stream->WS_Stream; /* pointer to writer struct */
    struct _EvpathPreloadMsg PreloadMsg;
    Svcs->verbose(WS_Stream->CP_Stream, DPPerRankVerbose,
                  "EVPATH Sending preload messages for timestep %ld\n", TS->Timestep);
    memset(&PreloadMsg, 0, sizeof(PreloadMsg));
    PreloadMsg.Timestep = TS->Timestep;
    PreloadMsg.DataLength = TS->Data.DataSize;
    PreloadMsg.Data = TS->Data.block;
    PreloadMsg.WriterRank = WS_Stream->Rank;

    for (int i = 0; i < WSR_Stream->ReaderCohortSize; i++)
    {
        if (WSR_Stream->ReaderRequestArray[i])
        {
            PreloadMsg.RS_Stream = WSR_Stream->ReaderContactInfo[i].RS_Stream;
            Svcs->verbose(WS_Stream->CP_Stream, DPTraceVerbose,
                          "EVPATH Preload message for timestep %ld, going to rank %d\n",
                          TS->Timestep, i);
            CMwrite(WSR_Stream->ReaderContactInfo[i].Conn, WS_Stream->PreloadFormat, &PreloadMsg);
        }
    }
}